

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall
BackwardPass::DeadStoreOrChangeInstrForScopeObjRemoval(BackwardPass *this,Instr **pInstrPrev)

{
  OpCode OVar1;
  ArgSlot formalsIndex;
  Func *this_00;
  Sym *sym;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint32 index;
  uint uVar6;
  SymOpnd *pSVar7;
  Opnd *pOVar8;
  undefined4 *puVar9;
  JITTimeFunctionBody *pJVar10;
  IntConstOpnd *pIVar11;
  RegOpnd *pRVar12;
  Instr *pIVar13;
  Instr *pIVar14;
  PropertySym *pPVar15;
  StackSym *pSVar16;
  char16 *pcVar17;
  BackwardPass *this_01;
  char *this_02;
  Instr *this_03;
  
  if (this->tag == DeadStorePhase) {
    this_03 = this->currentInstr;
    this_00 = this_03->m_func;
    bVar4 = Func::IsStackArgsEnabled(this_00);
    if (!bVar4) {
      return false;
    }
    if ((this->currentPrePassLoop == (Loop *)0x0) && (this->currentBlock->loop != (Loop *)0x0)) {
      return false;
    }
    OVar1 = this_03->m_opcode;
    if (OVar1 < CallHelper) {
      if (OVar1 == LdSlot) {
        this_01 = (BackwardPass *)this_03->m_src1;
        if (this_01 == (BackwardPass *)0x0) {
          return false;
        }
        OVar5 = IR::Opnd::GetKind((Opnd *)this_01);
        if (OVar5 != OpndKindSym) {
          return false;
        }
        pSVar7 = IR::Opnd::AsSymOpnd((Opnd *)this_01);
        sym = pSVar7->m_sym;
        if (sym == (Sym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          this_02 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
          ;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1001,"(sym)","sym");
          if (!bVar4) goto LAB_003dd771;
          *puVar9 = 0;
          bVar4 = IsFormalParamSym((BackwardPass *)this_02,this_00,(Sym *)0x0);
          if (!bVar4) {
            return false;
          }
        }
        else {
          bVar4 = IsFormalParamSym(this_01,this_00,sym);
          if (!bVar4) {
            return false;
          }
        }
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this_00->m_workItem);
        bVar4 = JITTimeFunctionBody::HasImplicitArgIns(pJVar10);
        if (bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1004,"(!currFunc->GetJITFunctionBody()->HasImplicitArgIns())",
                             "We don\'t have mappings between named formals and arguments object here"
                            );
          if (!bVar4) goto LAB_003dd771;
          *puVar9 = 0;
        }
        this_03->m_opcode = Ld_A;
        pPVar15 = Sym::AsPropertySym(sym);
        formalsIndex = (ArgSlot)pPVar15->m_propertyId;
        bVar4 = Func::HasStackSymForFormal(this_00,formalsIndex);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x100a,"(currFunc->HasStackSymForFormal(value))",
                             "currFunc->HasStackSymForFormal(value)");
          if (!bVar4) {
LAB_003dd771:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        pSVar16 = Func::GetStackSymForFormal(this_00,formalsIndex);
        pRVar12 = IR::RegOpnd::New(pSVar16,TyVar,this_00);
        IR::Opnd::SetIsJITOptimizedReg(&pRVar12->super_Opnd,true);
        IR::Instr::ReplaceSrc1(this_03,&pRVar12->super_Opnd);
        ProcessSymUse(this,&pSVar16->super_Sym,false,'\x01');
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,StackArgFormalsOptPhase);
        if (!bVar4) {
          return false;
        }
        if (DAT_015bc46a != '\x01') {
          return false;
        }
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this_03->m_func->m_workItem);
        pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this_03->m_func->m_workItem);
        uVar6 = JITTimeFunctionBody::GetFunctionNumber(pJVar10);
        Output::Print(L"StackArgFormals : %s (%d) :Replacing LdSlot with Ld_A in Deadstore pass. \n"
                      ,pcVar17,(ulong)uVar6);
        Output::Flush();
        return false;
      }
      if (OVar1 == GetCachedFunc) {
        bVar4 = IR::Opnd::IsScopeObjOpnd(this_03->m_src1,this_00);
        if (!bVar4) {
          return false;
        }
        this_03->m_opcode = NewScFunc;
        pOVar8 = IR::Instr::UnlinkSrc2(this_03);
        OVar5 = IR::Opnd::GetKind(pOVar8);
        if (OVar5 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1057,"(intConstOpnd->IsIntConstOpnd())",
                             "intConstOpnd->IsIntConstOpnd()");
          if (!bVar4) goto LAB_003dd771;
          *puVar9 = 0;
        }
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this_03->m_func->m_workItem);
        pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar8);
        index = IR::IntConstOpnd::AsUint32(pIVar11);
        uVar6 = JITTimeFunctionBody::GetNestedFuncIndexForSlotIdInCachedScope(pJVar10,index);
        IR::Opnd::Free(pOVar8,this_03->m_func);
        pIVar11 = IR::IntConstOpnd::New((ulong)uVar6,TyUint32,this_03->m_func,false);
        IR::Instr::ReplaceSrc1(this_03,&pIVar11->super_Opnd);
        pRVar12 = IR::RegOpnd::New(this_00->m_localFrameDisplaySym,TyVar,this_00);
        IR::Instr::SetSrc2(this_03,&pRVar12->super_Opnd);
        return false;
      }
      if (OVar1 != CommitScope) {
        return false;
      }
      pOVar8 = this_03->m_src1;
    }
    else {
      if (1 < OVar1 - 0x282) {
        if (OVar1 != CallHelper) {
          return false;
        }
        pOVar8 = this_03->m_src1;
        OVar5 = IR::Opnd::GetKind(pOVar8);
        if (OVar5 != OpndKindHelperCall) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
          if (!bVar4) goto LAB_003dd771;
          *puVar9 = 0;
        }
        if (*(int *)&pOVar8[1]._vptr_Opnd != 0x1a) {
          return false;
        }
        pSVar16 = IR::Opnd::GetStackSym(this_03->m_src2);
        if ((pSVar16->field_0x18 & 1) == 0) {
          pIVar13 = (Instr *)0x0;
        }
        else {
          pIVar13 = (pSVar16->field_5).m_instrDef;
        }
        pRVar12 = IR::Opnd::AsRegOpnd(pIVar13->m_src1);
        bVar4 = IR::Opnd::IsScopeObjOpnd(&pRVar12->super_Opnd,this_00);
        if (!bVar4) {
          return false;
        }
        pIVar13 = this_03->m_next;
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          if (this_03->m_src2 == (Opnd *)0x0) {
            IR::Instr::Remove(this_03);
            break;
          }
          pSVar16 = IR::Opnd::GetStackSym(this_03->m_src2);
          pIVar2 = (pSVar16->field_5).m_instrDef;
          pIVar14 = pIVar2;
          if ((pSVar16->field_0x18 & 1) == 0) {
            pIVar14 = (Instr *)0x0;
          }
          if (pIVar14->m_opcode != ArgOut_A) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x103e,"(instrDef->m_opcode == Js::OpCode::ArgOut_A)",
                               "instrDef->m_opcode == Js::OpCode::ArgOut_A");
            if (!bVar4) goto LAB_003dd771;
            *puVar9 = 0;
          }
          IR::Instr::Remove(this_03);
          this_03 = pIVar2;
        } while (pIVar2 != (Instr *)0x0);
        if (pIVar13 == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1046,"(nextInstr != nullptr)","nextInstr != nullptr");
          if (!bVar4) goto LAB_003dd771;
          *puVar9 = 0;
        }
        *pInstrPrev = pIVar13->m_prev;
        return true;
      }
      pOVar8 = this_03->m_src2;
    }
    bVar4 = IR::Opnd::IsScopeObjOpnd(pOVar8,this_00);
    if (bVar4) {
      IR::Instr::Remove(this_03);
      return true;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::DeadStoreOrChangeInstrForScopeObjRemoval(IR::Instr ** pInstrPrev)
{
    IR::Instr * instr = this->currentInstr;
    Func * currFunc = instr->m_func;

    if (this->tag == Js::DeadStorePhase && instr->m_func->IsStackArgsEnabled() && (IsPrePass() || !currentBlock->loop))
    {
        switch (instr->m_opcode)
        {
            /*
            *   This LdSlot loads the formal from the formals array. We replace this a Ld_A <ArgInSym>.
            *   ArgInSym is inserted at the beginning of the function during the start of the deadstore pass- for the top func.
            *   In case of inlinee, it will be from the source sym of the ArgOut Instruction to the inlinee.
            */
            case Js::OpCode::LdSlot:
            {
                IR::Opnd * src1 = instr->GetSrc1();
                if (src1 && src1->IsSymOpnd())
                {
                    Sym * sym = src1->AsSymOpnd()->m_sym;
                    Assert(sym);
                    if (IsFormalParamSym(currFunc, sym))
                    {
                        AssertMsg(!currFunc->GetJITFunctionBody()->HasImplicitArgIns(), "We don't have mappings between named formals and arguments object here");

                        instr->m_opcode = Js::OpCode::Ld_A;
                        PropertySym * propSym = sym->AsPropertySym();
                        Js::ArgSlot    value = (Js::ArgSlot)propSym->m_propertyId;

                        Assert(currFunc->HasStackSymForFormal(value));
                        StackSym * paramStackSym = currFunc->GetStackSymForFormal(value);
                        IR::RegOpnd * srcOpnd = IR::RegOpnd::New(paramStackSym, TyVar, currFunc);
                        srcOpnd->SetIsJITOptimizedReg(true);
                        instr->ReplaceSrc1(srcOpnd);
                        this->ProcessSymUse(paramStackSym, true, true);

                        if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase))
                        {
                            Output::Print(_u("StackArgFormals : %s (%d) :Replacing LdSlot with Ld_A in Deadstore pass. \n"), instr->m_func->GetJITFunctionBody()->GetDisplayName(), instr->m_func->GetFunctionNumber());
                            Output::Flush();
                        }
                    }
                }
                break;
            }
            case Js::OpCode::CommitScope:
            {
                if (instr->GetSrc1()->IsScopeObjOpnd(currFunc))
                {
                    instr->Remove();
                    return true;
                }
                break;
            }
            case Js::OpCode::BrFncCachedScopeEq:
            case Js::OpCode::BrFncCachedScopeNeq:
            {
                if (instr->GetSrc2()->IsScopeObjOpnd(currFunc))
                {
                    instr->Remove();
                    return true;
                }
                break;
            }
            case Js::OpCode::CallHelper:
            {
                //Remove the CALL and all its Argout instrs.
                if (instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperOP_InitCachedFuncs)
                {
                    IR::RegOpnd * scopeObjOpnd = instr->GetSrc2()->GetStackSym()->GetInstrDef()->GetSrc1()->AsRegOpnd();
                    if (scopeObjOpnd->IsScopeObjOpnd(currFunc))
                    {
                        IR::Instr * instrDef = instr;
                        IR::Instr * nextInstr = instr->m_next;

                        while (instrDef != nullptr)
                        {
                            IR::Instr * instrToDelete = instrDef;
                            if (instrDef->GetSrc2() != nullptr)
                            {
                                instrDef = instrDef->GetSrc2()->GetStackSym()->GetInstrDef();
                                Assert(instrDef->m_opcode == Js::OpCode::ArgOut_A);
                            }
                            else
                            {
                                instrDef = nullptr;
                            }
                            instrToDelete->Remove();
                        }
                        Assert(nextInstr != nullptr);
                        *pInstrPrev = nextInstr->m_prev;
                        return true;
                    }
                }
                break;
            }
            case Js::OpCode::GetCachedFunc:
            {
                // <dst> = GetCachedFunc <scopeObject>, <functionNum>
                // is converted to
                // <dst> = NewScFunc <functionNum>, <env: FrameDisplay>

                if (instr->GetSrc1()->IsScopeObjOpnd(currFunc))
                {
                    instr->m_opcode = Js::OpCode::NewScFunc;
                    IR::Opnd * intConstOpnd = instr->UnlinkSrc2();
                    Assert(intConstOpnd->IsIntConstOpnd());

                    uint nestedFuncIndex = instr->m_func->GetJITFunctionBody()->GetNestedFuncIndexForSlotIdInCachedScope(intConstOpnd->AsIntConstOpnd()->AsUint32());
                    intConstOpnd->Free(instr->m_func);

                    instr->ReplaceSrc1(IR::IntConstOpnd::New(nestedFuncIndex, TyUint32, instr->m_func));
                    instr->SetSrc2(IR::RegOpnd::New(currFunc->GetLocalFrameDisplaySym(), IRType::TyVar, currFunc));
                }
                break;
            }
        }
    }
    return false;
}